

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMvMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  vfloat<4> vVar2;
  size_t sVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined8 uVar11;
  ulong uVar12;
  ulong uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  bool bVar27;
  byte bVar28;
  int iVar29;
  AABBNodeMB4D *node1;
  long lVar30;
  long lVar31;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar32;
  byte bVar33;
  size_t sVar34;
  uint uVar35;
  byte bVar36;
  undefined4 uVar37;
  uint uVar38;
  NodeRef root;
  long lVar39;
  NodeRef *pNVar40;
  byte bVar41;
  ulong uVar42;
  ulong uVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  vint4 ai_2;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  vint4 ai_1;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 in_ZMM2 [64];
  vint4 ai_3;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  vint4 bi;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  vint4 bi_1;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  vint4 bi_3;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  vint4 bi_2;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  vint4 ai;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  uint local_19d4;
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  undefined1 local_1958 [16];
  BVH *local_1940;
  Intersectors *local_1938;
  ulong local_1930;
  long local_1928;
  long local_1920;
  TravRayK<4,_true> tray;
  undefined1 local_1838 [16];
  undefined1 local_1828 [16];
  undefined1 local_1818 [16];
  undefined1 local_1808 [16];
  undefined1 local_17f8 [16];
  undefined1 local_17e8 [8];
  float fStack_17e0;
  float fStack_17dc;
  undefined1 local_17d8 [8];
  float fStack_17d0;
  float fStack_17cc;
  vfloat<4> t;
  vfloat<4> v;
  vfloat<4> u;
  anon_union_48_2_4062524c_for_Vec3<embree::vfloat_impl<4>_>_1 local_1798;
  undefined8 local_1768;
  undefined8 uStack_1760;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1758;
  undefined1 local_1748 [16];
  undefined1 local_1738 [16];
  uint local_1728;
  uint uStack_1724;
  uint uStack_1720;
  uint uStack_171c;
  uint uStack_1718;
  uint uStack_1714;
  uint uStack_1710;
  uint uStack_170c;
  Vec3vf<4> Ng;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  local_1940 = (BVH *)This->ptr;
  stack_node[1].ptr = (local_1940->root).ptr;
  if (stack_node[1].ptr != 8) {
    auVar44 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar68 = ZEXT816(0) << 0x40;
    uVar11 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar68,5);
    uVar42 = vpcmpeqd_avx512vl(auVar44,(undefined1  [16])valid_i->field_0);
    uVar42 = ((byte)uVar11 & 0xf) & uVar42;
    bVar41 = (byte)uVar42;
    if (bVar41 != 0) {
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar93 = ZEXT1664(auVar44);
      auVar45 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar44);
      auVar48._8_4_ = 0x219392ef;
      auVar48._0_8_ = 0x219392ef219392ef;
      auVar48._12_4_ = 0x219392ef;
      uVar43 = vcmpps_avx512vl(auVar45,auVar48,1);
      auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar94 = ZEXT1664(auVar45);
      auVar46 = vdivps_avx512vl(auVar45,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar47 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar44);
      uVar12 = vcmpps_avx512vl(auVar47,auVar48,1);
      auVar47 = vdivps_avx512vl(auVar45,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar44 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar44);
      uVar13 = vcmpps_avx512vl(auVar44,auVar48,1);
      auVar44 = vdivps_avx512vl(auVar45,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      bVar27 = (bool)((byte)uVar43 & 1);
      tray.rdir.field_0._0_4_ = (uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar46._0_4_;
      bVar27 = (bool)((byte)(uVar43 >> 1) & 1);
      tray.rdir.field_0._4_4_ = (uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar46._4_4_;
      bVar27 = (bool)((byte)(uVar43 >> 2) & 1);
      tray.rdir.field_0._8_4_ = (uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar46._8_4_;
      bVar27 = (bool)((byte)(uVar43 >> 3) & 1);
      tray.rdir.field_0._12_4_ = (uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar46._12_4_;
      bVar27 = (bool)((byte)uVar12 & 1);
      tray.rdir.field_0._16_4_ = (uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar47._0_4_;
      bVar27 = (bool)((byte)(uVar12 >> 1) & 1);
      tray.rdir.field_0._20_4_ = (uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar47._4_4_;
      bVar27 = (bool)((byte)(uVar12 >> 2) & 1);
      tray.rdir.field_0._24_4_ = (uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar47._8_4_;
      bVar27 = (bool)((byte)(uVar12 >> 3) & 1);
      tray.rdir.field_0._28_4_ = (uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar47._12_4_;
      bVar27 = (bool)((byte)uVar13 & 1);
      tray.rdir.field_0._32_4_ = (uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar44._0_4_;
      bVar27 = (bool)((byte)(uVar13 >> 1) & 1);
      tray.rdir.field_0._36_4_ = (uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar44._4_4_;
      bVar27 = (bool)((byte)(uVar13 >> 2) & 1);
      tray.rdir.field_0._40_4_ = (uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar44._8_4_;
      bVar27 = (bool)((byte)(uVar13 >> 3) & 1);
      tray.rdir.field_0._44_4_ = (uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar44._12_4_;
      uVar43 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar68,1);
      auVar44 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar43 & 1) * auVar44._0_4_;
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar43 >> 1) & 1) * auVar44._4_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar43 >> 2) & 1) * auVar44._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar43 >> 3) & 1) * auVar44._12_4_;
      uVar43 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar68,5);
      auVar44 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar27 = (bool)((byte)uVar43 & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar27 * auVar44._0_4_ | (uint)!bVar27 * 0x30;
      bVar27 = (bool)((byte)(uVar43 >> 1) & 1);
      tray.nearXYZ.field_0._20_4_ = (uint)bVar27 * auVar44._4_4_ | (uint)!bVar27 * 0x30;
      bVar27 = (bool)((byte)(uVar43 >> 2) & 1);
      tray.nearXYZ.field_0._24_4_ = (uint)bVar27 * auVar44._8_4_ | (uint)!bVar27 * 0x30;
      bVar27 = (bool)((byte)(uVar43 >> 3) & 1);
      tray.nearXYZ.field_0._28_4_ = (uint)bVar27 * auVar44._12_4_ | (uint)!bVar27 * 0x30;
      uVar43 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar68,5);
      auVar44 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar27 = (bool)((byte)uVar43 & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar27 * auVar44._0_4_ | (uint)!bVar27 * 0x50;
      bVar27 = (bool)((byte)(uVar43 >> 1) & 1);
      tray.nearXYZ.field_0._36_4_ = (uint)bVar27 * auVar44._4_4_ | (uint)!bVar27 * 0x50;
      bVar27 = (bool)((byte)(uVar43 >> 2) & 1);
      tray.nearXYZ.field_0._40_4_ = (uint)bVar27 * auVar44._8_4_ | (uint)!bVar27 * 0x50;
      bVar27 = (bool)((byte)(uVar43 >> 3) & 1);
      tray.nearXYZ.field_0._44_4_ = (uint)bVar27 * auVar44._12_4_ | (uint)!bVar27 * 0x50;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar95 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar44 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar68);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar41 & 1) * auVar44._0_4_ |
           (uint)!(bool)(bVar41 & 1) * stack_near[0].field_0._0_4_;
      bVar27 = (bool)((byte)(uVar42 >> 1) & 1);
      tray.tnear.field_0._4_4_ =
           (uint)bVar27 * auVar44._4_4_ | (uint)!bVar27 * stack_near[0].field_0._4_4_;
      bVar27 = (bool)((byte)(uVar42 >> 2) & 1);
      tray.tnear.field_0._8_4_ =
           (uint)bVar27 * auVar44._8_4_ | (uint)!bVar27 * stack_near[0].field_0._8_4_;
      bVar27 = SUB81(uVar42 >> 3,0);
      tray.tnear.field_0._12_4_ =
           (uint)bVar27 * auVar44._12_4_ | (uint)!bVar27 * stack_near[0].field_0._12_4_;
      auVar44 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar68);
      tray.tfar.field_0.i[0] =
           (uint)(bVar41 & 1) * auVar44._0_4_ | (uint)!(bool)(bVar41 & 1) * -0x800000;
      bVar27 = (bool)((byte)(uVar42 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar27 * auVar44._4_4_ | (uint)!bVar27 * -0x800000;
      bVar27 = (bool)((byte)(uVar42 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar27 * auVar44._8_4_ | (uint)!bVar27 * -0x800000;
      bVar27 = SUB81(uVar42 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar27 * auVar44._12_4_ | (uint)!bVar27 * -0x800000;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar35 = 3;
      }
      else {
        uVar35 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      uVar42 = uVar42 ^ 0xf;
      pNVar40 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar32 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
      auVar96 = ZEXT1664(auVar44);
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
      auVar97 = ZEXT1664(auVar44);
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
      auVar98 = ZEXT1664(auVar44);
      local_1938 = This;
LAB_01c8f477:
      local_19d4 = (uint)uVar42;
LAB_01c8f47d:
      do {
        do {
          root.ptr = pNVar40[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01c900ff;
          pNVar40 = pNVar40 + -1;
          paVar32 = paVar32 + -1;
          vVar2.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar32->v;
          auVar92 = ZEXT1664((undefined1  [16])vVar2.field_0);
          uVar42 = vcmpps_avx512vl((undefined1  [16])vVar2.field_0,
                                   (undefined1  [16])tray.tfar.field_0,1);
        } while ((char)uVar42 == '\0');
        uVar37 = (undefined4)uVar42;
        if (uVar35 < (uint)POPCOUNT(uVar37)) {
LAB_01c8f4bd:
          do {
            lVar30 = -0x10;
            uVar38 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01c900ff;
              uVar11 = vcmpps_avx512vl(auVar92._0_16_,(undefined1  [16])tray.tfar.field_0,9);
              if ((char)uVar11 == '\0') goto LAB_01c8f47d;
              local_1928 = (ulong)(uVar38 & 0xf) - 8;
              bVar33 = ~(byte)local_19d4 & 0xf;
              lVar39 = (root.ptr & 0xfffffffffffffff0) + 0x130;
              lVar30 = 0;
              goto LAB_01c8f839;
            }
            uVar11 = vcmpps_avx512vl(auVar92._0_16_,(undefined1  [16])tray.tfar.field_0,9);
            uVar42 = root.ptr & 0xfffffffffffffff0;
            root.ptr = 8;
            auVar44 = auVar95._0_16_;
            for (; (auVar92 = ZEXT1664(auVar44), lVar30 != 0 &&
                   (sVar3 = *(size_t *)(uVar42 + 0x20 + lVar30 * 2), sVar3 != 8));
                lVar30 = lVar30 + 4) {
              uVar37 = *(undefined4 *)(uVar42 + 0x90 + lVar30);
              auVar74._4_4_ = uVar37;
              auVar74._0_4_ = uVar37;
              auVar74._8_4_ = uVar37;
              auVar74._12_4_ = uVar37;
              auVar68 = *(undefined1 (*) [16])(ray + 0x70);
              uVar37 = *(undefined4 *)(uVar42 + 0x30 + lVar30);
              auVar16._4_4_ = uVar37;
              auVar16._0_4_ = uVar37;
              auVar16._8_4_ = uVar37;
              auVar16._12_4_ = uVar37;
              auVar45 = vfmadd213ps_avx512vl(auVar74,auVar68,auVar16);
              uVar37 = *(undefined4 *)(uVar42 + 0xb0 + lVar30);
              auVar76._4_4_ = uVar37;
              auVar76._0_4_ = uVar37;
              auVar76._8_4_ = uVar37;
              auVar76._12_4_ = uVar37;
              uVar37 = *(undefined4 *)(uVar42 + 0x50 + lVar30);
              auVar17._4_4_ = uVar37;
              auVar17._0_4_ = uVar37;
              auVar17._8_4_ = uVar37;
              auVar17._12_4_ = uVar37;
              auVar46 = vfmadd213ps_avx512vl(auVar76,auVar68,auVar17);
              uVar37 = *(undefined4 *)(uVar42 + 0xd0 + lVar30);
              auVar78._4_4_ = uVar37;
              auVar78._0_4_ = uVar37;
              auVar78._8_4_ = uVar37;
              auVar78._12_4_ = uVar37;
              uVar37 = *(undefined4 *)(uVar42 + 0x70 + lVar30);
              auVar18._4_4_ = uVar37;
              auVar18._0_4_ = uVar37;
              auVar18._8_4_ = uVar37;
              auVar18._12_4_ = uVar37;
              auVar47 = vfmadd213ps_avx512vl(auVar78,auVar68,auVar18);
              uVar37 = *(undefined4 *)(uVar42 + 0xa0 + lVar30);
              auVar80._4_4_ = uVar37;
              auVar80._0_4_ = uVar37;
              auVar80._8_4_ = uVar37;
              auVar80._12_4_ = uVar37;
              uVar37 = *(undefined4 *)(uVar42 + 0x40 + lVar30);
              auVar19._4_4_ = uVar37;
              auVar19._0_4_ = uVar37;
              auVar19._8_4_ = uVar37;
              auVar19._12_4_ = uVar37;
              auVar48 = vfmadd213ps_avx512vl(auVar80,auVar68,auVar19);
              uVar37 = *(undefined4 *)(uVar42 + 0xc0 + lVar30);
              auVar82._4_4_ = uVar37;
              auVar82._0_4_ = uVar37;
              auVar82._8_4_ = uVar37;
              auVar82._12_4_ = uVar37;
              uVar37 = *(undefined4 *)(uVar42 + 0x60 + lVar30);
              auVar20._4_4_ = uVar37;
              auVar20._0_4_ = uVar37;
              auVar20._8_4_ = uVar37;
              auVar20._12_4_ = uVar37;
              auVar49 = vfmadd213ps_avx512vl(auVar82,auVar68,auVar20);
              uVar37 = *(undefined4 *)(uVar42 + 0xe0 + lVar30);
              auVar85._4_4_ = uVar37;
              auVar85._0_4_ = uVar37;
              auVar85._8_4_ = uVar37;
              auVar85._12_4_ = uVar37;
              uVar37 = *(undefined4 *)(uVar42 + 0x80 + lVar30);
              auVar21._4_4_ = uVar37;
              auVar21._0_4_ = uVar37;
              auVar21._8_4_ = uVar37;
              auVar21._12_4_ = uVar37;
              auVar50 = vfmadd213ps_avx512vl(auVar85,auVar68,auVar21);
              auVar24._8_8_ = tray.org.field_0._8_8_;
              auVar24._0_8_ = tray.org.field_0._0_8_;
              auVar25._8_8_ = tray.org.field_0._24_8_;
              auVar25._0_8_ = tray.org.field_0._16_8_;
              auVar26._8_8_ = tray.org.field_0._40_8_;
              auVar26._0_8_ = tray.org.field_0._32_8_;
              auVar45 = vsubps_avx(auVar45,auVar24);
              auVar90._0_4_ = tray.rdir.field_0._0_4_ * auVar45._0_4_;
              auVar90._4_4_ = tray.rdir.field_0._4_4_ * auVar45._4_4_;
              auVar90._8_4_ = tray.rdir.field_0._8_4_ * auVar45._8_4_;
              auVar90._12_4_ = tray.rdir.field_0._12_4_ * auVar45._12_4_;
              auVar45 = vsubps_avx(auVar46,auVar25);
              auVar77._0_4_ = auVar45._0_4_ * (float)tray.rdir.field_0._16_4_;
              auVar77._4_4_ = auVar45._4_4_ * (float)tray.rdir.field_0._20_4_;
              auVar77._8_4_ = auVar45._8_4_ * (float)tray.rdir.field_0._24_4_;
              auVar77._12_4_ = auVar45._12_4_ * (float)tray.rdir.field_0._28_4_;
              auVar45 = vsubps_avx(auVar47,auVar26);
              auVar79._0_4_ = tray.rdir.field_0._32_4_ * auVar45._0_4_;
              auVar79._4_4_ = tray.rdir.field_0._36_4_ * auVar45._4_4_;
              auVar79._8_4_ = tray.rdir.field_0._40_4_ * auVar45._8_4_;
              auVar79._12_4_ = tray.rdir.field_0._44_4_ * auVar45._12_4_;
              auVar45 = vsubps_avx(auVar48,auVar24);
              auVar81._0_4_ = tray.rdir.field_0._0_4_ * auVar45._0_4_;
              auVar81._4_4_ = tray.rdir.field_0._4_4_ * auVar45._4_4_;
              auVar81._8_4_ = tray.rdir.field_0._8_4_ * auVar45._8_4_;
              auVar81._12_4_ = tray.rdir.field_0._12_4_ * auVar45._12_4_;
              auVar45 = vsubps_avx(auVar49,auVar25);
              auVar83._0_4_ = auVar45._0_4_ * (float)tray.rdir.field_0._16_4_;
              auVar83._4_4_ = auVar45._4_4_ * (float)tray.rdir.field_0._20_4_;
              auVar83._8_4_ = auVar45._8_4_ * (float)tray.rdir.field_0._24_4_;
              auVar83._12_4_ = auVar45._12_4_ * (float)tray.rdir.field_0._28_4_;
              auVar45 = vsubps_avx(auVar50,auVar26);
              auVar86._0_4_ = tray.rdir.field_0._32_4_ * auVar45._0_4_;
              auVar86._4_4_ = tray.rdir.field_0._36_4_ * auVar45._4_4_;
              auVar86._8_4_ = tray.rdir.field_0._40_4_ * auVar45._8_4_;
              auVar86._12_4_ = tray.rdir.field_0._44_4_ * auVar45._12_4_;
              auVar45 = vpminsd_avx(auVar90,auVar81);
              auVar46 = vpminsd_avx(auVar77,auVar83);
              auVar45 = vpmaxsd_avx(auVar45,auVar46);
              auVar46 = vpminsd_avx(auVar79,auVar86);
              auVar45 = vpmaxsd_avx(auVar45,auVar46);
              auVar47 = vmulps_avx512vl(auVar45,auVar96._0_16_);
              auVar45 = vpmaxsd_avx(auVar90,auVar81);
              auVar46 = vpmaxsd_avx(auVar77,auVar83);
              auVar46 = vpminsd_avx(auVar45,auVar46);
              auVar45 = vpmaxsd_avx(auVar79,auVar86);
              auVar45 = vpminsd_avx(auVar46,auVar45);
              auVar46 = vmulps_avx512vl(auVar45,auVar97._0_16_);
              auVar45 = vpmaxsd_avx(auVar47,(undefined1  [16])tray.tnear.field_0);
              auVar46 = vpminsd_avx(auVar46,(undefined1  [16])tray.tfar.field_0);
              uVar14 = vcmpps_avx512vl(auVar45,auVar46,2);
              bVar33 = (byte)uVar14;
              if ((uVar38 & 7) == 6) {
                uVar37 = *(undefined4 *)(uVar42 + 0x100 + lVar30);
                auVar22._4_4_ = uVar37;
                auVar22._0_4_ = uVar37;
                auVar22._8_4_ = uVar37;
                auVar22._12_4_ = uVar37;
                uVar14 = vcmpps_avx512vl(auVar68,auVar22,1);
                uVar37 = *(undefined4 *)(uVar42 + 0xf0 + lVar30);
                auVar23._4_4_ = uVar37;
                auVar23._0_4_ = uVar37;
                auVar23._8_4_ = uVar37;
                auVar23._12_4_ = uVar37;
                uVar15 = vcmpps_avx512vl(auVar68,auVar23,0xd);
                bVar33 = (byte)uVar14 & (byte)uVar15 & bVar33;
              }
              bVar33 = bVar33 & (byte)uVar11;
              sVar34 = root.ptr;
              auVar51 = auVar44;
              if (bVar33 != 0) {
                auVar45 = vblendmps_avx512vl(auVar95._0_16_,auVar47);
                auVar51._0_4_ =
                     (uint)(bVar33 & 1) * auVar45._0_4_ | (uint)!(bool)(bVar33 & 1) * auVar68._0_4_;
                bVar27 = (bool)(bVar33 >> 1 & 1);
                auVar51._4_4_ = (uint)bVar27 * auVar45._4_4_ | (uint)!bVar27 * auVar68._4_4_;
                bVar27 = (bool)(bVar33 >> 2 & 1);
                auVar51._8_4_ = (uint)bVar27 * auVar45._8_4_ | (uint)!bVar27 * auVar68._8_4_;
                bVar27 = (bool)(bVar33 >> 3 & 1);
                auVar51._12_4_ = (uint)bVar27 * auVar45._12_4_ | (uint)!bVar27 * auVar68._12_4_;
                sVar34 = sVar3;
                if (root.ptr != 8) {
                  pNVar40->ptr = root.ptr;
                  pNVar40 = pNVar40 + 1;
                  *(undefined1 (*) [16])paVar32->v = auVar44;
                  paVar32 = paVar32 + 1;
                }
              }
              auVar44 = auVar51;
              root.ptr = sVar34;
            }
            if (root.ptr == 8) goto LAB_01c8f6c3;
            uVar11 = vcmpps_avx512vl(auVar44,(undefined1  [16])tray.tfar.field_0,9);
          } while ((byte)uVar35 < (byte)POPCOUNT((int)uVar11));
          pNVar40->ptr = root.ptr;
          pNVar40 = pNVar40 + 1;
          *(undefined1 (*) [16])paVar32->v = auVar44;
          paVar32 = paVar32 + 1;
LAB_01c8f6c3:
          iVar29 = 4;
        }
        else {
          while (uVar42 != 0) {
            sVar3 = 0;
            for (uVar43 = uVar42; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x8000000000000000) {
              sVar3 = sVar3 + 1;
            }
            uVar42 = uVar42 - 1 & uVar42;
            bVar27 = occluded1(local_1938,local_1940,root,sVar3,&pre,ray,&tray,context);
            auVar44 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
            auVar98 = ZEXT1664(auVar44);
            auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar95 = ZEXT1664(auVar44);
            bVar33 = (byte)(1 << ((uint)sVar3 & 0x1f));
            if (!bVar27) {
              bVar33 = 0;
            }
            local_19d4 = (uint)((byte)local_19d4 | bVar33);
          }
          iVar29 = 3;
          auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
          auVar96 = ZEXT1664(auVar44);
          auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
          auVar97 = ZEXT1664(auVar44);
          auVar92 = ZEXT1664((undefined1  [16])vVar2.field_0);
          if ((byte)local_19d4 != 0xf) {
            auVar44 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            tray.tfar.field_0.i[0] =
                 (uint)((byte)local_19d4 & 1) * auVar44._0_4_ |
                 (uint)!(bool)((byte)local_19d4 & 1) * tray.tfar.field_0.i[0];
            bVar27 = (bool)((byte)(local_19d4 >> 1) & 1);
            tray.tfar.field_0.i[1] =
                 (uint)bVar27 * auVar44._4_4_ | (uint)!bVar27 * tray.tfar.field_0.i[1];
            bVar27 = (bool)((byte)(local_19d4 >> 2) & 1);
            tray.tfar.field_0.i[2] =
                 (uint)bVar27 * auVar44._8_4_ | (uint)!bVar27 * tray.tfar.field_0.i[2];
            bVar27 = (bool)((byte)(local_19d4 >> 3) & 1);
            tray.tfar.field_0.i[3] =
                 (uint)bVar27 * auVar44._12_4_ | (uint)!bVar27 * tray.tfar.field_0.i[3];
            iVar29 = 2;
          }
          auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar93 = ZEXT1664(auVar44);
          auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar94 = ZEXT1664(auVar44);
          if (uVar35 < (uint)POPCOUNT(uVar37)) goto LAB_01c8f4bd;
        }
      } while ((iVar29 == 4) || (iVar29 == 2));
      goto LAB_01c900ff;
    }
  }
  return;
LAB_01c8f839:
  do {
    lVar31 = -0x10;
    bVar36 = bVar33;
    if (lVar30 == local_1928) goto LAB_01c900c2;
    do {
      local_1920 = lVar30;
      if ((lVar31 == 0) || (uVar42 = (ulong)*(uint *)(lVar39 + lVar31), uVar42 == 0xffffffff))
      goto LAB_01c900a5;
      auVar44 = *(undefined1 (*) [16])(ray + 0x70);
      uVar37 = *(undefined4 *)(lVar39 + -0x90 + lVar31);
      auVar52._4_4_ = uVar37;
      auVar52._0_4_ = uVar37;
      auVar52._8_4_ = uVar37;
      auVar52._12_4_ = uVar37;
      uVar37 = *(undefined4 *)(lVar39 + -0x80 + lVar31);
      auVar53._4_4_ = uVar37;
      auVar53._0_4_ = uVar37;
      auVar53._8_4_ = uVar37;
      auVar53._12_4_ = uVar37;
      uVar37 = *(undefined4 *)(lVar39 + -0x70 + lVar31);
      auVar54._4_4_ = uVar37;
      auVar54._0_4_ = uVar37;
      auVar54._8_4_ = uVar37;
      auVar54._12_4_ = uVar37;
      uVar37 = *(undefined4 *)(lVar39 + -0x120 + lVar31);
      auVar68._4_4_ = uVar37;
      auVar68._0_4_ = uVar37;
      auVar68._8_4_ = uVar37;
      auVar68._12_4_ = uVar37;
      auVar52 = vfmadd213ps_avx512vl(auVar52,auVar44,auVar68);
      uVar37 = *(undefined4 *)(lVar39 + -0x110 + lVar31);
      auVar45._4_4_ = uVar37;
      auVar45._0_4_ = uVar37;
      auVar45._8_4_ = uVar37;
      auVar45._12_4_ = uVar37;
      auVar53 = vfmadd213ps_avx512vl(auVar53,auVar44,auVar45);
      uVar37 = *(undefined4 *)(lVar39 + -0x100 + lVar31);
      auVar46._4_4_ = uVar37;
      auVar46._0_4_ = uVar37;
      auVar46._8_4_ = uVar37;
      auVar46._12_4_ = uVar37;
      auVar54 = vfmadd213ps_avx512vl(auVar54,auVar44,auVar46);
      uVar37 = *(undefined4 *)(lVar39 + -0x60 + lVar31);
      auVar55._4_4_ = uVar37;
      auVar55._0_4_ = uVar37;
      auVar55._8_4_ = uVar37;
      auVar55._12_4_ = uVar37;
      uVar37 = *(undefined4 *)(lVar39 + -0x50 + lVar31);
      auVar56._4_4_ = uVar37;
      auVar56._0_4_ = uVar37;
      auVar56._8_4_ = uVar37;
      auVar56._12_4_ = uVar37;
      uVar37 = *(undefined4 *)(lVar39 + -0x40 + lVar31);
      auVar57._4_4_ = uVar37;
      auVar57._0_4_ = uVar37;
      auVar57._8_4_ = uVar37;
      auVar57._12_4_ = uVar37;
      uVar37 = *(undefined4 *)(lVar39 + -0xf0 + lVar31);
      auVar47._4_4_ = uVar37;
      auVar47._0_4_ = uVar37;
      auVar47._8_4_ = uVar37;
      auVar47._12_4_ = uVar37;
      auVar55 = vfmadd213ps_avx512vl(auVar55,auVar44,auVar47);
      uVar37 = *(undefined4 *)(lVar39 + -0xe0 + lVar31);
      auVar49._4_4_ = uVar37;
      auVar49._0_4_ = uVar37;
      auVar49._8_4_ = uVar37;
      auVar49._12_4_ = uVar37;
      auVar56 = vfmadd213ps_avx512vl(auVar56,auVar44,auVar49);
      uVar37 = *(undefined4 *)(lVar39 + -0xd0 + lVar31);
      auVar50._4_4_ = uVar37;
      auVar50._0_4_ = uVar37;
      auVar50._8_4_ = uVar37;
      auVar50._12_4_ = uVar37;
      auVar57 = vfmadd213ps_avx512vl(auVar57,auVar44,auVar50);
      uVar37 = *(undefined4 *)(lVar39 + -0x30 + lVar31);
      auVar61._4_4_ = uVar37;
      auVar61._0_4_ = uVar37;
      auVar61._8_4_ = uVar37;
      auVar61._12_4_ = uVar37;
      uVar37 = *(undefined4 *)(lVar39 + -0x20 + lVar31);
      auVar62._4_4_ = uVar37;
      auVar62._0_4_ = uVar37;
      auVar62._8_4_ = uVar37;
      auVar62._12_4_ = uVar37;
      uVar37 = *(undefined4 *)(lVar39 + -0x10 + lVar31);
      auVar63._4_4_ = uVar37;
      auVar63._0_4_ = uVar37;
      auVar63._8_4_ = uVar37;
      auVar63._12_4_ = uVar37;
      uVar37 = *(undefined4 *)(lVar39 + -0xc0 + lVar31);
      auVar58._4_4_ = uVar37;
      auVar58._0_4_ = uVar37;
      auVar58._8_4_ = uVar37;
      auVar58._12_4_ = uVar37;
      auVar58 = vfmadd213ps_avx512vl(auVar61,auVar44,auVar58);
      uVar37 = *(undefined4 *)(lVar39 + -0xb0 + lVar31);
      auVar59._4_4_ = uVar37;
      auVar59._0_4_ = uVar37;
      auVar59._8_4_ = uVar37;
      auVar59._12_4_ = uVar37;
      auVar59 = vfmadd213ps_avx512vl(auVar62,auVar44,auVar59);
      uVar37 = *(undefined4 *)(lVar39 + -0xa0 + lVar31);
      auVar60._4_4_ = uVar37;
      auVar60._0_4_ = uVar37;
      auVar60._8_4_ = uVar37;
      auVar60._12_4_ = uVar37;
      auVar60 = vfmadd213ps_avx512vl(auVar63,auVar44,auVar60);
      auVar44 = *(undefined1 (*) [16])ray;
      auVar68 = *(undefined1 (*) [16])(ray + 0x10);
      auVar45 = *(undefined1 (*) [16])(ray + 0x20);
      auVar46 = *(undefined1 (*) [16])(ray + 0x40);
      auVar47 = *(undefined1 (*) [16])(ray + 0x50);
      auVar48 = *(undefined1 (*) [16])(ray + 0x60);
      auVar49 = vsubps_avx(auVar52,auVar44);
      auVar50 = vsubps_avx(auVar53,auVar68);
      auVar52 = vsubps_avx512vl(auVar54,auVar45);
      auVar53 = vsubps_avx512vl(auVar55,auVar44);
      auVar54 = vsubps_avx512vl(auVar56,auVar68);
      auVar55 = vsubps_avx512vl(auVar57,auVar45);
      auVar58 = vsubps_avx512vl(auVar58,auVar44);
      auVar59 = vsubps_avx512vl(auVar59,auVar68);
      auVar60 = vsubps_avx512vl(auVar60,auVar45);
      auVar56 = vsubps_avx512vl(auVar58,auVar49);
      auVar57 = vsubps_avx512vl(auVar59,auVar50);
      auVar61 = vsubps_avx512vl(auVar60,auVar52);
      auVar62 = vsubps_avx512vl(auVar49,auVar53);
      auVar63 = vsubps_avx512vl(auVar50,auVar54);
      auVar64 = vsubps_avx512vl(auVar52,auVar55);
      auVar65 = vsubps_avx512vl(auVar53,auVar58);
      auVar66 = vsubps_avx512vl(auVar54,auVar59);
      auVar67 = vsubps_avx512vl(auVar55,auVar60);
      auVar44 = vaddps_avx512vl(auVar58,auVar49);
      auVar68 = vaddps_avx512vl(auVar59,auVar50);
      auVar45 = vaddps_avx512vl(auVar60,auVar52);
      auVar69 = vmulps_avx512vl(auVar68,auVar61);
      auVar69 = vfmsub231ps_avx512vl(auVar69,auVar57,auVar45);
      auVar45 = vmulps_avx512vl(auVar45,auVar56);
      auVar45 = vfmsub231ps_avx512vl(auVar45,auVar61,auVar44);
      auVar70._0_4_ = auVar44._0_4_ * auVar57._0_4_;
      auVar70._4_4_ = auVar44._4_4_ * auVar57._4_4_;
      auVar70._8_4_ = auVar44._8_4_ * auVar57._8_4_;
      auVar70._12_4_ = auVar44._12_4_ * auVar57._12_4_;
      auVar44 = vfmsub231ps_fma(auVar70,auVar56,auVar68);
      fVar7 = auVar48._0_4_;
      auVar89._0_4_ = auVar44._0_4_ * fVar7;
      fVar8 = auVar48._4_4_;
      auVar89._4_4_ = auVar44._4_4_ * fVar8;
      fVar9 = auVar48._8_4_;
      auVar89._8_4_ = auVar44._8_4_ * fVar9;
      fVar10 = auVar48._12_4_;
      auVar89._12_4_ = auVar44._12_4_ * fVar10;
      auVar44 = vfmadd231ps_avx512vl(auVar89,auVar47,auVar45);
      auVar45 = vfmadd231ps_avx512vl(auVar44,auVar46,auVar69);
      auVar44 = vaddps_avx512vl(auVar49,auVar53);
      auVar68 = vaddps_avx512vl(auVar50,auVar54);
      auVar69 = vaddps_avx512vl(auVar52,auVar55);
      auVar70 = vmulps_avx512vl(auVar68,auVar64);
      auVar70 = vfmsub231ps_avx512vl(auVar70,auVar63,auVar69);
      auVar69 = vmulps_avx512vl(auVar69,auVar62);
      auVar69 = vfmsub231ps_avx512vl(auVar69,auVar64,auVar44);
      auVar44 = vmulps_avx512vl(auVar44,auVar63);
      auVar44 = vfmsub231ps_avx512vl(auVar44,auVar62,auVar68);
      auVar91._0_4_ = auVar44._0_4_ * fVar7;
      auVar91._4_4_ = auVar44._4_4_ * fVar8;
      auVar91._8_4_ = auVar44._8_4_ * fVar9;
      auVar91._12_4_ = auVar44._12_4_ * fVar10;
      auVar44 = vfmadd231ps_avx512vl(auVar91,auVar47,auVar69);
      auVar69 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar68 = vfmadd231ps_avx512vl(auVar44,auVar46,auVar70);
      auVar44 = vaddps_avx512vl(auVar53,auVar58);
      auVar58 = vaddps_avx512vl(auVar54,auVar59);
      auVar59 = vaddps_avx512vl(auVar55,auVar60);
      auVar60 = vmulps_avx512vl(auVar58,auVar67);
      auVar60 = vfmsub231ps_avx512vl(auVar60,auVar66,auVar59);
      auVar59 = vmulps_avx512vl(auVar59,auVar65);
      auVar59 = vfmsub231ps_avx512vl(auVar59,auVar67,auVar44);
      auVar44 = vmulps_avx512vl(auVar44,auVar66);
      auVar44 = vfmsub231ps_avx512vl(auVar44,auVar65,auVar58);
      auVar44 = vmulps_avx512vl(auVar44,auVar48);
      auVar44 = vfmadd231ps_avx512vl(auVar44,auVar47,auVar59);
      auVar48 = vfmadd231ps_avx512vl(auVar44,auVar46,auVar60);
      auVar44 = vaddps_avx512vl(auVar45,auVar68);
      auVar44 = vaddps_avx512vl(auVar48,auVar44);
      auVar53 = auVar93._0_16_;
      auVar58 = vandps_avx512vl(auVar44,auVar53);
      auVar58 = vmulps_avx512vl(auVar58,auVar98._0_16_);
      auVar59 = vminps_avx512vl(auVar45,auVar68);
      auVar59 = vminps_avx512vl(auVar59,auVar48);
      auVar60 = vxorps_avx512vl(auVar58,auVar69);
      uVar11 = vcmpps_avx512vl(auVar59,auVar60,5);
      auVar59 = vmaxps_avx512vl(auVar45,auVar68);
      auVar48 = vmaxps_avx512vl(auVar59,auVar48);
      uVar14 = vcmpps_avx512vl(auVar48,auVar58,2);
      bVar28 = ((byte)uVar11 | (byte)uVar14) & 0xf & bVar36;
      auVar48 = auVar94._0_16_;
      if (bVar28 == 0) {
LAB_01c8fc69:
        bVar28 = 0;
        auVar64 = local_1838;
        auVar65 = local_1828;
        auVar66 = local_1818;
        auVar67 = local_1808;
        auVar44 = local_17f8;
        auVar68 = _local_17e8;
        auVar45 = _local_17d8;
      }
      else {
        auVar58 = vmulps_avx512vl(auVar63,auVar61);
        auVar59 = vmulps_avx512vl(auVar56,auVar64);
        auVar60 = vmulps_avx512vl(auVar62,auVar57);
        auVar54 = vmulps_avx512vl(auVar66,auVar64);
        auVar55 = vmulps_avx512vl(auVar62,auVar67);
        auVar70 = vmulps_avx512vl(auVar65,auVar63);
        auVar57 = vfmsub213ps_avx512vl(auVar57,auVar64,auVar58);
        auVar61 = vfmsub213ps_avx512vl(auVar61,auVar62,auVar59);
        auVar56 = vfmsub213ps_avx512vl(auVar56,auVar63,auVar60);
        auVar63 = vfmsub213ps_avx512vl(auVar67,auVar63,auVar54);
        auVar64 = vfmsub213ps_avx512vl(auVar65,auVar64,auVar55);
        auVar62 = vfmsub213ps_avx512vl(auVar66,auVar62,auVar70);
        auVar58 = vandps_avx512vl(auVar58,auVar53);
        auVar54 = vandps_avx512vl(auVar54,auVar53);
        uVar43 = vcmpps_avx512vl(auVar58,auVar54,1);
        auVar58 = vandps_avx512vl(auVar59,auVar53);
        auVar59 = vandps_avx512vl(auVar55,auVar53);
        uVar12 = vcmpps_avx512vl(auVar58,auVar59,1);
        auVar58 = vandps_avx512vl(auVar60,auVar53);
        auVar59 = vandps_avx512vl(auVar70,auVar53);
        uVar13 = vcmpps_avx512vl(auVar58,auVar59,1);
        bVar27 = (bool)((byte)uVar43 & 1);
        auVar66._0_4_ = (uint)bVar27 * auVar57._0_4_ | (uint)!bVar27 * auVar63._0_4_;
        bVar27 = (bool)((byte)(uVar43 >> 1) & 1);
        auVar66._4_4_ = (uint)bVar27 * auVar57._4_4_ | (uint)!bVar27 * auVar63._4_4_;
        bVar27 = (bool)((byte)(uVar43 >> 2) & 1);
        auVar66._8_4_ = (uint)bVar27 * auVar57._8_4_ | (uint)!bVar27 * auVar63._8_4_;
        bVar27 = (bool)((byte)(uVar43 >> 3) & 1);
        auVar66._12_4_ = (uint)bVar27 * auVar57._12_4_ | (uint)!bVar27 * auVar63._12_4_;
        bVar27 = (bool)((byte)uVar12 & 1);
        auVar65._0_4_ = (uint)bVar27 * auVar61._0_4_ | (uint)!bVar27 * auVar64._0_4_;
        bVar27 = (bool)((byte)(uVar12 >> 1) & 1);
        auVar65._4_4_ = (uint)bVar27 * auVar61._4_4_ | (uint)!bVar27 * auVar64._4_4_;
        bVar27 = (bool)((byte)(uVar12 >> 2) & 1);
        auVar65._8_4_ = (uint)bVar27 * auVar61._8_4_ | (uint)!bVar27 * auVar64._8_4_;
        bVar27 = (bool)((byte)(uVar12 >> 3) & 1);
        auVar65._12_4_ = (uint)bVar27 * auVar61._12_4_ | (uint)!bVar27 * auVar64._12_4_;
        bVar27 = (bool)((byte)uVar13 & 1);
        auVar64._0_4_ = (float)((uint)bVar27 * auVar56._0_4_ | (uint)!bVar27 * auVar62._0_4_);
        bVar27 = (bool)((byte)(uVar13 >> 1) & 1);
        auVar64._4_4_ = (float)((uint)bVar27 * auVar56._4_4_ | (uint)!bVar27 * auVar62._4_4_);
        bVar27 = (bool)((byte)(uVar13 >> 2) & 1);
        auVar64._8_4_ = (float)((uint)bVar27 * auVar56._8_4_ | (uint)!bVar27 * auVar62._8_4_);
        bVar27 = (bool)((byte)(uVar13 >> 3) & 1);
        auVar64._12_4_ = (float)((uint)bVar27 * auVar56._12_4_ | (uint)!bVar27 * auVar62._12_4_);
        auVar88._0_4_ = fVar7 * auVar64._0_4_;
        auVar88._4_4_ = fVar8 * auVar64._4_4_;
        auVar88._8_4_ = fVar9 * auVar64._8_4_;
        auVar88._12_4_ = fVar10 * auVar64._12_4_;
        auVar47 = vfmadd213ps_fma(auVar47,auVar65,auVar88);
        auVar46 = vfmadd213ps_fma(auVar46,auVar66,auVar47);
        auVar84._0_4_ = auVar46._0_4_ + auVar46._0_4_;
        auVar84._4_4_ = auVar46._4_4_ + auVar46._4_4_;
        auVar84._8_4_ = auVar46._8_4_ + auVar46._8_4_;
        auVar84._12_4_ = auVar46._12_4_ + auVar46._12_4_;
        auVar87._0_4_ = auVar52._0_4_ * auVar64._0_4_;
        auVar87._4_4_ = auVar52._4_4_ * auVar64._4_4_;
        auVar87._8_4_ = auVar52._8_4_ * auVar64._8_4_;
        auVar87._12_4_ = auVar52._12_4_ * auVar64._12_4_;
        auVar46 = vfmadd213ps_fma(auVar50,auVar65,auVar87);
        auVar47 = vfmadd213ps_fma(auVar49,auVar66,auVar46);
        auVar46 = vrcp14ps_avx512vl(auVar84);
        auVar49 = vxorps_avx512vl(auVar84,auVar69);
        auVar50 = vfnmadd213ps_avx512vl(auVar46,auVar84,auVar48);
        auVar46 = vfmadd132ps_fma(auVar50,auVar46,auVar46);
        auVar67._0_4_ = (auVar47._0_4_ + auVar47._0_4_) * auVar46._0_4_;
        auVar67._4_4_ = (auVar47._4_4_ + auVar47._4_4_) * auVar46._4_4_;
        auVar67._8_4_ = (auVar47._8_4_ + auVar47._8_4_) * auVar46._8_4_;
        auVar67._12_4_ = (auVar47._12_4_ + auVar47._12_4_) * auVar46._12_4_;
        uVar11 = vcmpps_avx512vl(auVar67,*(undefined1 (*) [16])(ray + 0x80),2);
        uVar14 = vcmpps_avx512vl(auVar67,*(undefined1 (*) [16])(ray + 0x30),0xd);
        uVar15 = vcmpps_avx512vl(auVar84,auVar49,4);
        bVar28 = bVar28 & (byte)uVar11 & (byte)uVar14 & (byte)uVar15;
        if (bVar28 == 0) goto LAB_01c8fc69;
      }
      _local_17d8 = auVar45;
      _local_17e8 = auVar68;
      local_17f8 = auVar44;
      local_1808 = auVar67;
      local_1818 = auVar66;
      local_1828 = auVar65;
      local_1838 = auVar64;
      pGVar4 = (context->scene->geometries).items[uVar42].ptr;
      uVar38 = pGVar4->mask;
      auVar44._4_4_ = uVar38;
      auVar44._0_4_ = uVar38;
      auVar44._8_4_ = uVar38;
      auVar44._12_4_ = uVar38;
      uVar11 = vptestmd_avx512vl(auVar44,*(undefined1 (*) [16])(ray + 0x90));
      bVar28 = (byte)uVar11 & 0xf & bVar28;
      uVar43 = (ulong)bVar28;
      if (bVar28 != 0) {
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar44 = vandps_avx512vl(local_17f8,auVar53);
          auVar69._8_4_ = 0x219392ef;
          auVar69._0_8_ = 0x219392ef219392ef;
          auVar69._12_4_ = 0x219392ef;
          uVar12 = vcmpps_avx512vl(auVar44,auVar69,5);
          auVar44 = vrcp14ps_avx512vl(local_17f8);
          auVar68 = vfnmadd213ps_avx512vl(auVar44,local_17f8,auVar48);
          auVar44 = vfmadd132ps_avx512vl(auVar68,auVar44,auVar44);
          fVar7 = (float)((uint)((byte)uVar12 & 1) * auVar44._0_4_);
          fVar8 = (float)((uint)((byte)(uVar12 >> 1) & 1) * auVar44._4_4_);
          fVar9 = (float)((uint)((byte)(uVar12 >> 2) & 1) * auVar44._8_4_);
          fVar10 = (float)((uint)((byte)(uVar12 >> 3) & 1) * auVar44._12_4_);
          auVar73._0_4_ = fVar7 * (float)local_17d8._0_4_;
          auVar73._4_4_ = fVar8 * (float)local_17d8._4_4_;
          auVar73._8_4_ = fVar9 * fStack_17d0;
          auVar73._12_4_ = fVar10 * fStack_17cc;
          local_1748 = vminps_avx512vl(auVar73,auVar48);
          auVar75._0_4_ = fVar7 * (float)local_17e8._0_4_;
          auVar75._4_4_ = fVar8 * (float)local_17e8._4_4_;
          auVar75._8_4_ = fVar9 * fStack_17e0;
          auVar75._12_4_ = fVar10 * fStack_17dc;
          local_1758 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vminps_avx512vl(auVar75,auVar48);
          local_1798._0_8_ = local_1818._0_8_;
          local_1798._8_8_ = local_1818._8_8_;
          local_1798._16_8_ = local_1828._0_8_;
          local_1798._24_8_ = local_1828._8_8_;
          local_1798._32_8_ = local_1838._0_8_;
          local_1798._40_8_ = local_1838._8_8_;
          local_1768 = local_1808._0_8_;
          uStack_1760 = local_1808._8_8_;
          args.valid = (int *)&Ng;
          args.geometryUserPtr = &t;
          args.context = (RTCRayQueryContext *)&v;
          args.ray = (RTCRayN *)&u;
          local_1930 = uVar42;
          std::
          _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
          ::
          _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                    ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                      *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                               *)&local_1798.field_0);
          local_1738 = vpbroadcastd_avx512vl();
          local_1748 = vpbroadcastd_avx512vl();
          local_1798._0_8_ = Ng.field_0._0_8_;
          local_1798._8_8_ = Ng.field_0._8_8_;
          local_1798._16_8_ = Ng.field_0._16_8_;
          local_1798._24_8_ = Ng.field_0._24_8_;
          local_1798._32_8_ = Ng.field_0._32_8_;
          local_1798._40_8_ = Ng.field_0._40_8_;
          local_1768 = u.field_0._0_8_;
          uStack_1760 = u.field_0._8_8_;
          local_1758 = v.field_0;
          vpcmpeqd_avx2(ZEXT1632(local_1738),ZEXT1632(local_1738));
          uStack_1724 = context->user->instID[0];
          local_1728 = uStack_1724;
          uStack_1720 = uStack_1724;
          uStack_171c = uStack_1724;
          uStack_1718 = context->user->instPrimID[0];
          uStack_1714 = uStack_1718;
          uStack_1710 = uStack_1718;
          uStack_170c = uStack_1718;
          auVar44 = *(undefined1 (*) [16])(ray + 0x80);
          auVar68 = vblendmps_avx512vl(auVar44,(undefined1  [16])t.field_0);
          bVar27 = (bool)(bVar28 >> 1 & 1);
          bVar6 = (bool)(bVar28 >> 2 & 1);
          *(uint *)(ray + 0x80) =
               (uint)(bVar28 & 1) * auVar68._0_4_ | !(bool)(bVar28 & 1) * uStack_1718;
          *(uint *)(ray + 0x84) = (uint)bVar27 * auVar68._4_4_ | !bVar27 * uStack_1718;
          *(uint *)(ray + 0x88) = (uint)bVar6 * auVar68._8_4_ | !bVar6 * uStack_1718;
          *(uint *)(ray + 0x8c) =
               (uint)(bVar28 >> 3) * auVar68._12_4_ | !(bool)(bVar28 >> 3) * uStack_1718;
          local_1958 = vpmovm2d_avx512vl(uVar43);
          args.valid = (int *)local_1958;
          args.geometryUserPtr = pGVar4->userPtr;
          args.context = context->user;
          args.hit = (RTCHitN *)&local_1798;
          args.N = 4;
          args.ray = (RTCRayN *)ray;
          if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar4->occlusionFilterN)(&args);
          }
          uVar42 = vptestmd_avx512vl(local_1958,local_1958);
          if ((uVar42 & 0xf) == 0) {
            uVar43 = 0;
            auVar68 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar93 = ZEXT1664(auVar68);
            auVar68 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar94 = ZEXT1664(auVar68);
            auVar68 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar95 = ZEXT1664(auVar68);
            auVar68 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
            auVar96 = ZEXT1664(auVar68);
            auVar68 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
            auVar97 = ZEXT1664(auVar68);
            auVar68 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
            auVar98 = ZEXT1664(auVar68);
          }
          else {
            p_Var5 = context->args->filter;
            if (p_Var5 == (RTCFilterFunctionN)0x0) {
              auVar68 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar93 = ZEXT1664(auVar68);
              auVar68 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar94 = ZEXT1664(auVar68);
              auVar68 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar95 = ZEXT1664(auVar68);
              auVar68 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
              auVar96 = ZEXT1664(auVar68);
              auVar68 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
              auVar97 = ZEXT1664(auVar68);
              auVar68 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
              auVar98 = ZEXT1664(auVar68);
            }
            else {
              auVar68 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar93 = ZEXT1664(auVar68);
              auVar68 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar94 = ZEXT1664(auVar68);
              auVar68 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar95 = ZEXT1664(auVar68);
              auVar68 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
              auVar96 = ZEXT1664(auVar68);
              auVar68 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
              auVar97 = ZEXT1664(auVar68);
              auVar68 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
              auVar98 = ZEXT1664(auVar68);
              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar4->field_8).field_0x2 & 0x40) != 0)) {
                (*p_Var5)(&args);
                auVar68 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                auVar98 = ZEXT1664(auVar68);
                auVar68 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                auVar97 = ZEXT1664(auVar68);
                auVar68 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                auVar96 = ZEXT1664(auVar68);
                auVar68 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar95 = ZEXT1664(auVar68);
                auVar68 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar94 = ZEXT1664(auVar68);
                auVar68 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar93 = ZEXT1664(auVar68);
              }
            }
            uVar43 = vptestmd_avx512vl(local_1958,local_1958);
            uVar43 = uVar43 & 0xf;
            auVar68 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar27 = (bool)((byte)uVar43 & 1);
            auVar71._0_4_ = (uint)bVar27 * auVar68._0_4_ | (uint)!bVar27 * *(int *)(args.ray + 0x80)
            ;
            bVar27 = (bool)((byte)(uVar43 >> 1) & 1);
            auVar71._4_4_ = (uint)bVar27 * auVar68._4_4_ | (uint)!bVar27 * *(int *)(args.ray + 0x84)
            ;
            bVar27 = (bool)((byte)(uVar43 >> 2) & 1);
            auVar71._8_4_ = (uint)bVar27 * auVar68._8_4_ | (uint)!bVar27 * *(int *)(args.ray + 0x88)
            ;
            bVar27 = SUB81(uVar43 >> 3,0);
            auVar71._12_4_ =
                 (uint)bVar27 * auVar68._12_4_ | (uint)!bVar27 * *(int *)(args.ray + 0x8c);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar71;
          }
          bVar27 = (bool)((byte)uVar43 & 1);
          auVar72._0_4_ = (uint)bVar27 * *(int *)pRVar1 | (uint)!bVar27 * auVar44._0_4_;
          bVar27 = (bool)((byte)(uVar43 >> 1) & 1);
          auVar72._4_4_ = (uint)bVar27 * *(int *)(ray + 0x84) | (uint)!bVar27 * auVar44._4_4_;
          bVar27 = (bool)((byte)(uVar43 >> 2) & 1);
          auVar72._8_4_ = (uint)bVar27 * *(int *)(ray + 0x88) | (uint)!bVar27 * auVar44._8_4_;
          bVar27 = SUB81(uVar43 >> 3,0);
          auVar72._12_4_ = (uint)bVar27 * *(int *)(ray + 0x8c) | (uint)!bVar27 * auVar44._12_4_;
          *(undefined1 (*) [16])pRVar1 = auVar72;
        }
        bVar36 = ((byte)uVar43 ^ 0xf) & bVar36;
      }
      lVar31 = lVar31 + 4;
      lVar30 = local_1920;
    } while (bVar36 != 0);
    bVar36 = 0;
LAB_01c900a5:
    lVar30 = local_1920 + 1;
    lVar39 = lVar39 + 0x140;
    bVar33 = bVar33 & bVar36;
  } while (bVar33 != 0);
  bVar33 = 0;
LAB_01c900c2:
  local_19d4._0_1_ = ~bVar33 & 0xf | (byte)local_19d4;
  uVar42 = (ulong)(byte)local_19d4;
  if ((byte)local_19d4 == 0xf) {
    local_19d4._0_1_ = 0xf;
LAB_01c900ff:
    local_19d4._0_1_ = (byte)local_19d4 & bVar41;
    bVar27 = (bool)((byte)local_19d4 >> 1 & 1);
    bVar6 = (bool)((byte)local_19d4 >> 2 & 1);
    *(uint *)pRVar1 =
         (uint)((byte)local_19d4 & 1) * -0x800000 |
         (uint)!(bool)((byte)local_19d4 & 1) * *(int *)pRVar1;
    *(uint *)(ray + 0x84) = (uint)bVar27 * -0x800000 | (uint)!bVar27 * *(int *)(ray + 0x84);
    *(uint *)(ray + 0x88) = (uint)bVar6 * -0x800000 | (uint)!bVar6 * *(int *)(ray + 0x88);
    *(uint *)(ray + 0x8c) =
         (uint)((byte)local_19d4 >> 3) * -0x800000 |
         (uint)!(bool)((byte)local_19d4 >> 3) * *(int *)(ray + 0x8c);
    return;
  }
  auVar44 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  tray.tfar.field_0.i[0] =
       (uint)((byte)local_19d4 & 1) * auVar44._0_4_ |
       (uint)!(bool)((byte)local_19d4 & 1) * tray.tfar.field_0.i[0];
  bVar27 = (bool)((byte)local_19d4 >> 1 & 1);
  tray.tfar.field_0.i[1] = (uint)bVar27 * auVar44._4_4_ | (uint)!bVar27 * tray.tfar.field_0.i[1];
  bVar27 = (bool)((byte)local_19d4 >> 2 & 1);
  tray.tfar.field_0.i[2] = (uint)bVar27 * auVar44._8_4_ | (uint)!bVar27 * tray.tfar.field_0.i[2];
  bVar27 = (bool)((byte)local_19d4 >> 3 & 1);
  tray.tfar.field_0.i[3] = (uint)bVar27 * auVar44._12_4_ | (uint)!bVar27 * tray.tfar.field_0.i[3];
  goto LAB_01c8f477;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }